

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

TryEmplaceResult * __thiscall
QHash<std::pair<QString,QString>,QString>::tryEmplace_impl<std::pair<QString,QString>const&>
          (TryEmplaceResult *__return_storage_ptr__,void *this,pair<QString,_QString> *key)

{
  uchar uVar1;
  Span *pSVar2;
  Data<QHashPrivate::Node<std::pair<QString,_QString>,_QString>_> *pDVar3;
  QHashMultiReturnType<QString,_QString> hash;
  Node<std::pair<QString,_QString>,_QString> *this_00;
  uint uVar6;
  long in_FS_OFFSET;
  Bucket BVar7;
  Bucket BVar8;
  QHash<std::pair<QString,_QString>,_QString> local_40;
  long local_38;
  Span *pSVar4;
  ulong uVar5;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = *this;
  if (pDVar3 == (Data<QHashPrivate::Node<std::pair<QString,_QString>,_QString>_> *)0x0) {
    pDVar3 = QHashPrivate::Data<QHashPrivate::Node<std::pair<QString,_QString>,_QString>_>::detached
                       ((Data<QHashPrivate::Node<std::pair<QString,_QString>,_QString>_> *)0x0);
    *(Data<QHashPrivate::Node<std::pair<QString,_QString>,_QString>_> **)this = pDVar3;
  }
  local_40.d = (Data *)0x0;
  hash = qHashMulti<QString,QString>(pDVar3->seed,&key->first,&key->second);
  BVar7 = QHashPrivate::Data<QHashPrivate::Node<std::pair<QString,QString>,QString>>::
          findBucketWithHash<std::pair<QString,QString>>(*this,key,hash);
  uVar5 = BVar7.index;
  pSVar4 = BVar7.span;
  uVar1 = pSVar4->offsets[uVar5];
  pDVar3 = *this;
  if ((pDVar3 == (Data<QHashPrivate::Node<std::pair<QString,_QString>,_QString>_> *)0x0) ||
     (1 < (uint)(pDVar3->ref).atomic._q_value.super___atomic_base<int>._M_i)) {
    QHash<std::pair<QString,_QString>,_QString>::operator=
              (&local_40,(QHash<std::pair<QString,_QString>,_QString> *)this);
    if (uVar1 == 0xff) {
LAB_0028c36b:
      pDVar3 = *this;
      if (pDVar3->numBuckets >> 1 <= pDVar3->size) {
        pDVar3 = QHashPrivate::Data<QHashPrivate::Node<std::pair<QString,_QString>,_QString>_>::
                 detached(pDVar3,pDVar3->size + 1);
        *(Data<QHashPrivate::Node<std::pair<QString,_QString>,_QString>_> **)this = pDVar3;
        BVar8 = QHashPrivate::Data<QHashPrivate::Node<std::pair<QString,QString>,QString>>::
                findBucketWithHash<std::pair<QString,QString>>
                          ((Data<QHashPrivate::Node<std::pair<QString,QString>,QString>> *)pDVar3,
                           key,hash);
        goto LAB_0028c3de;
      }
    }
    else {
      pDVar3 = *this;
    }
    pSVar2 = pDVar3->spans;
    pDVar3 = QHashPrivate::Data<QHashPrivate::Node<std::pair<QString,_QString>,_QString>_>::detached
                       (pDVar3);
    *(Data<QHashPrivate::Node<std::pair<QString,_QString>,_QString>_> **)this = pDVar3;
    uVar6 = (uint)BVar7.index & 0x7f;
    BVar8.index._0_4_ = uVar6;
    BVar8.span = pDVar3->spans +
                 ((((ulong)((long)pSVar4 - (long)pSVar2) >> 4) * 0x1c71c71c71c71c80 | uVar5) >> 7);
    BVar8.index._4_4_ = 0;
    BVar7.index._0_4_ = uVar6;
    BVar7.span = pDVar3->spans +
                 ((((ulong)((long)pSVar4 - (long)pSVar2) >> 4) * 0x1c71c71c71c71c80 | uVar5) >> 7);
    BVar7.index._4_4_ = 0;
    if (uVar1 != 0xff) goto LAB_0028c40d;
  }
  else {
    if (uVar1 != 0xff) goto LAB_0028c40d;
    BVar8 = BVar7;
    if (pDVar3->numBuckets >> 1 <= pDVar3->size) {
      QHash<std::pair<QString,_QString>,_QString>::operator=
                (&local_40,(QHash<std::pair<QString,_QString>,_QString> *)this);
      goto LAB_0028c36b;
    }
  }
LAB_0028c3de:
  BVar7 = BVar8;
  this_00 = QHashPrivate::Span<QHashPrivate::Node<std::pair<QString,_QString>,_QString>_>::insert
                      (BVar7.span,BVar7.index);
  std::pair<QString,_QString>::pair(&this_00->key,key);
  (this_00->value).d.d = (Data *)0x0;
  (this_00->value).d.ptr = (char16_t *)0x0;
  (this_00->value).d.size = 0;
  pDVar3 = *this;
  pDVar3->size = pDVar3->size + 1;
LAB_0028c40d:
  pSVar4 = pDVar3->spans;
  (__return_storage_ptr__->iterator).i.d = pDVar3;
  (__return_storage_ptr__->iterator).i.bucket =
       ((ulong)((long)BVar7.span - (long)pSVar4) >> 4) * 0x1c71c71c71c71c80 | BVar7.index;
  __return_storage_ptr__->inserted = uVar1 == 0xff;
  QHash<std::pair<QString,_QString>,_QString>::~QHash(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

TryEmplaceResult tryEmplace_impl(K &&key, Args &&...args)
    {
        if (!d)
            detach();
        QHash detachGuard;

        size_t hash = QHashPrivate::calculateHash(key, d->seed);
        typename Data::Bucket bucket = d->findBucketWithHash(key, hash);
        const bool shouldInsert = bucket.isUnused();

        // Even if we don't insert we may have to detach because we are
        // returning a non-const iterator:
        if (!isDetached() || (shouldInsert && d->shouldGrow())) {
            detachGuard = *this;
            const bool resized = shouldInsert && d->shouldGrow();
            const size_t bucketIndex = bucket.toBucketIndex(d);

            // Must detach from detachGuard
            d = resized ? Data::detached(d, d->size + 1) : Data::detached(d);
            bucket = resized ? d->findBucketWithHash(key, hash) : typename Data::Bucket(d, bucketIndex);
        }
        if (shouldInsert) {
            Node *n = bucket.insert();
            using ConstructProxy = typename QHashPrivate::HeterogenousConstructProxy<Key, K>;
            Node::createInPlace(n, ConstructProxy(std::forward<K>(key)),
                                std::forward<Args>(args)...);
            ++d->size;
        }
        return {iterator(bucket.toIterator(d)), shouldInsert};
    }